

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char *__path;
  int iVar1;
  int *piVar2;
  undefined8 extraout_RAX;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  allocator local_19;
  
  do {
    iVar1 = close(*(int *)((long)child_arg + 8));
    if (iVar1 != -1) goto LAB_0013490e;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  std::__cxx11::string::string((string *)&local_108,"CHECK failed: File ",&local_19);
  std::operator+(&local_e8,&local_108,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/vendor/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_40,&local_e8,", line ");
  local_c4 = 0x3c2;
  StreamableToString<int>(&local_128,&local_c4);
  std::operator+(&local_60,&local_40,&local_128);
  std::operator+(&local_80,&local_60,": ");
  std::operator+(&local_a0,&local_80,"close(args->close_fd)");
  std::operator+(&local_c0,&local_a0," != -1");
  DeathTestAbort(&local_c0);
LAB_0013490e:
  UnitTest::GetInstance();
  __path = ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_._M_dataplus.
           _M_p;
  iVar1 = chdir(__path);
  if (iVar1 == 0) {
    execve(**child_arg,*child_arg,_environ);
    std::__cxx11::string::string((string *)&local_e8,"execve(",(allocator *)&local_128);
    std::operator+(&local_40,&local_e8,(char *)**child_arg);
    std::operator+(&local_60,&local_40,", ...) in ");
    std::operator+(&local_80,&local_60,__path);
    std::operator+(&local_a0,&local_80," failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(&local_c0,&local_a0,&local_108);
    DeathTestAbort(&local_c0);
  }
  std::__cxx11::string::string((string *)&local_60,"chdir(\"",(allocator *)&local_e8);
  std::operator+(&local_80,&local_60,__path);
  std::operator+(&local_a0,&local_80,"\") failed: ");
  GetLastErrnoDescription_abi_cxx11_();
  std::operator+(&local_c0,&local_a0,&local_40);
  DeathTestAbort(&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execve() as it's a direct system call.  We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execve() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execve(args->argv[0], args->argv, GetEnviron());
  DeathTestAbort(std::string("execve(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}